

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int create_esni_aead(ptls_aead_context_t **aead_ctx,int is_enc,ptls_cipher_suite_t *cipher,
                    ptls_iovec_t ecdh_secret,uint8_t *esni_contents_hash)

{
  int is_enc_00;
  ptls_aead_context_t *ppVar1;
  long in_RDX;
  undefined8 *in_RDI;
  void *in_R9;
  ptls_iovec_t pVar2;
  int ret;
  uint8_t aead_secret [64];
  void *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint8_t *puVar3;
  undefined1 *puVar4;
  ptls_iovec_t in_stack_ffffffffffffff60;
  void *secret;
  ptls_hash_algorithm_t *in_stack_ffffffffffffff88;
  ptls_aead_algorithm_t *in_stack_ffffffffffffff90;
  ptls_iovec_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffb0;
  
  puVar3 = *(uint8_t **)(in_RDX + 0x10);
  puVar4 = &stack0xffffffffffffff88;
  pVar2 = ptls_iovec_init((void *)0x0,0);
  secret = (void *)pVar2.len;
  pVar2.len = (size_t)puVar4;
  pVar2.base = puVar3;
  is_enc_00 = ptls_hkdf_extract((ptls_hash_algorithm_t *)
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                in_stack_ffffffffffffff40,in_stack_ffffffffffffff60,pVar2);
  if (is_enc_00 == 0) {
    ptls_iovec_init(in_R9,*(size_t *)(*(long *)(in_RDX + 0x10) + 8));
    ppVar1 = new_aead(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,is_enc_00,secret,
                      in_stack_ffffffffffffff98,in_stack_ffffffffffffffb0);
    *in_RDI = ppVar1;
    if (ppVar1 == (ptls_aead_context_t *)0x0) {
      is_enc_00 = 0x201;
    }
    else {
      is_enc_00 = 0;
    }
  }
  (*ptls_clear_memory)(&stack0xffffffffffffff88,0x40);
  return is_enc_00;
}

Assistant:

static int create_esni_aead(ptls_aead_context_t **aead_ctx, int is_enc, ptls_cipher_suite_t *cipher, ptls_iovec_t ecdh_secret,
                            const uint8_t *esni_contents_hash)
{
    uint8_t aead_secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = ptls_hkdf_extract(cipher->hash, aead_secret, ptls_iovec_init(NULL, 0), ecdh_secret)) != 0)
        goto Exit;
    if ((*aead_ctx = new_aead(cipher->aead, cipher->hash, is_enc, aead_secret,
                              ptls_iovec_init(esni_contents_hash, cipher->hash->digest_size), "tls13 esni ")) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    ret = 0;
Exit:
    ptls_clear_memory(aead_secret, sizeof(aead_secret));
    return ret;
}